

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmLib.c
# Opt level: O2

void Sfm_LibTest(void)

{
  void *pvVar1;
  Sfm_Lib_t *p;
  
  pvVar1 = Abc_FrameReadLibGen();
  if (pvVar1 != (void *)0x0) {
    p = Sfm_LibPrepare(7,1,1,1,1);
    Sfm_LibPrint(p);
    Sfm_LibStop(p);
    return;
  }
  puts("There is no current library.");
  return;
}

Assistant:

void Sfm_LibTest()
{
    Sfm_Lib_t * p;
    int fVerbose = 1;
    if ( Abc_FrameReadLibGen() == NULL )
    {
        printf( "There is no current library.\n" );
        return;
    }
    p = Sfm_LibPrepare( 7, 1, 1, 1, fVerbose );
    if ( fVerbose )
        Sfm_LibPrint( p );
    Sfm_LibStop( p );
}